

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
GenexEvaluator::EvaluateExpression
          (string *__return_storage_ptr__,GenexEvaluator *this,string *genexOperator,
          string *expression,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  cmGeneratorTarget *target;
  Result RVar1;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  cmListFileBacktrace local_c8;
  undefined1 local_b8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  string *expression_local;
  string *genexOperator_local;
  GenexEvaluator *this_local;
  
  dagChecker._120_8_ = content;
  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (__return_storage_ptr__,expression,context->LG,context,context->HeadTarget,
               context->CurrentTarget,dagCheckerParent);
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace(&local_c8,&context->Backtrace);
    target = context->HeadTarget;
    std::operator+(&local_108,genexOperator,":");
    std::operator+(&local_e8,&local_108,expression);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_b8,&local_c8,target,&local_e8,
               (GeneratorExpressionContent *)dagChecker._120_8_,dagCheckerParent);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
    RVar1 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_b8);
    if ((RVar1 == DAG) || (1 < RVar1 - SELF_REFERENCE)) {
      cmGeneratorExpressionNode::EvaluateDependentExpression
                (__return_storage_ptr__,expression,context->LG,context,context->HeadTarget,
                 context->CurrentTarget,(cmGeneratorExpressionDAGChecker *)local_b8);
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_138,(GeneratorExpressionContent *)dagChecker._120_8_);
      cmGeneratorExpressionDAGChecker::ReportError
                ((cmGeneratorExpressionDAGChecker *)local_b8,context,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EvaluateExpression(
    const std::string& genexOperator, const std::string& expression,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const
  {
    if (context->HeadTarget) {
      cmGeneratorExpressionDAGChecker dagChecker(
        context->Backtrace, context->HeadTarget,
        genexOperator + ":" + expression, content, dagCheckerParent);
      switch (dagChecker.Check()) {
        case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE: {
          dagChecker.ReportError(context, content->GetOriginalExpression());
          return std::string();
        }
        case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        case cmGeneratorExpressionDAGChecker::DAG:
          break;
      }

      return this->EvaluateDependentExpression(
        expression, context->LG, context, context->HeadTarget,
        context->CurrentTarget, &dagChecker);
    }

    return this->EvaluateDependentExpression(
      expression, context->LG, context, context->HeadTarget,
      context->CurrentTarget, dagCheckerParent);
  }